

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O3

_Bool write_stdout(void *buffer,size_t nbytes)

{
  uint __errnum;
  uint __fd;
  ssize_t sVar1;
  uint *puVar2;
  char *pcVar3;
  size_t sVar4;
  
  __fd = fileno(_stdout);
  sVar4 = 0;
  do {
    sVar1 = write(__fd,(void *)((long)buffer + sVar4),nbytes - sVar4);
    if (got_exit_signal != 0) {
      logmsg("signalled to die");
LAB_00105ffe:
      sVar4 = 0xffffffffffffffff;
      goto LAB_00106018;
    }
    if (sVar1 < 0) {
      puVar2 = (uint *)__errno_location();
      __errnum = *puVar2;
      if ((__errnum != 4) && (__errnum != 0xb)) {
        logmsg("writing to file descriptor: %d,",(ulong)__fd);
        pcVar3 = strerror(__errnum);
        logmsg("unrecoverable write() failure: (%d) %s",(ulong)__errnum,pcVar3);
        goto LAB_00105ffe;
      }
    }
    else {
      if (sVar1 == 0) {
        sVar4 = 0;
        logmsg("put 0 writing to stdout");
        goto LAB_00106018;
      }
      sVar4 = sVar4 + sVar1;
    }
  } while (sVar4 < nbytes);
  if (verbose == '\x01') {
    logmsg("wrote %zd bytes",sVar4);
  }
LAB_00106018:
  if (sVar4 != nbytes) {
    logmsg("exiting...");
  }
  return sVar4 == nbytes;
}

Assistant:

static bool write_stdout(const void *buffer, size_t nbytes)
{
  ssize_t nwrite = fullwrite(fileno(stdout), buffer, nbytes);
  if(nwrite != (ssize_t)nbytes) {
    logmsg("exiting...");
    return FALSE;
  }
  return TRUE;
}